

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

cmRulePlaceholderExpander * __thiscall
cmLocalNinjaGenerator::CreateRulePlaceholderExpander(cmLocalNinjaGenerator *this)

{
  cmRulePlaceholderExpander *this_00;
  allocator<char> local_39;
  string local_38;
  cmRulePlaceholderExpander *local_18;
  cmRulePlaceholderExpander *ret;
  cmLocalNinjaGenerator *this_local;
  
  ret = (cmRulePlaceholderExpander *)this;
  this_00 = cmLocalGenerator::CreateRulePlaceholderExpander((cmLocalGenerator *)this);
  local_18 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"$TARGET_IMPLIB",&local_39)
  ;
  cmRulePlaceholderExpander::SetTargetImpLib(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return local_18;
}

Assistant:

cmRulePlaceholderExpander*
cmLocalNinjaGenerator::CreateRulePlaceholderExpander() const
{
  cmRulePlaceholderExpander* ret =
    this->cmLocalGenerator::CreateRulePlaceholderExpander();
  ret->SetTargetImpLib("$TARGET_IMPLIB");
  return ret;
}